

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.cc
# Opt level: O1

void __thiscall OpenMesh::ArrayKernel::init_bit_masks(ArrayKernel *this,BitMaskContainer *_bmc)

{
  iterator __position;
  uint local_1c;
  
  local_1c = 0x100;
  do {
    __position._M_current =
         (_bmc->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (_bmc->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)_bmc,__position,&local_1c);
    }
    else {
      *__position._M_current = local_1c;
      (_bmc->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    local_1c = local_1c * 2;
  } while (local_1c != 0);
  return;
}

Assistant:

void ArrayKernel::init_bit_masks(BitMaskContainer& _bmc)
{
  for (unsigned int i = Attributes::UNUSED; i != 0; i <<= 1)
  {
    _bmc.push_back(i);
  }
}